

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLogger::~SimpleLogger(SimpleLogger *this)

{
  string *in_RDI;
  SimpleLogger *in_stack_00000008;
  vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_> *in_stack_fffffffffffffff0;
  
  stop(in_stack_00000008);
  std::vector<SimpleLogger::LogElem,_std::allocator<SimpleLogger::LogElem>_>::~vector
            (in_stack_fffffffffffffff0);
  std::ofstream::~ofstream(in_RDI + 0x38);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

SimpleLogger::~SimpleLogger() {
    stop();
}